

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

MemberSyntax * __thiscall slang::parsing::Parser::parseClockingItem(Parser *this)

{
  SyntaxFactory *this_00;
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  ClockingSkewSyntax *inputSkew;
  ClockingSkewSyntax *outputSkew;
  ClockingDirectionSyntax *direction;
  DefaultSkewItemSyntax *pDVar4;
  MemberSyntax *pMVar5;
  AttributeSpecSyntax *pAVar6;
  undefined8 extraout_RAX;
  undefined4 extraout_var;
  ClockingItemSyntax *pCVar7;
  uint uVar8;
  Info *extraout_RDX;
  Token TVar9;
  string_view sVar10;
  Token TVar11;
  Token semi;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> decls;
  Token local_158;
  Token local_148;
  Token local_138;
  Token local_128;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_118;
  uint local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  Token local_e8;
  Token local_d8;
  SyntaxKind local_c8;
  pointer local_b8;
  undefined1 local_a8 [24];
  TokenOrSyntax local_90 [4];
  
  Token::Token(&local_148);
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  uVar8 = TVar9.kind - 0xc2;
  if ((0x26 < uVar8) || ((0x4000000003U >> ((ulong)uVar8 & 0x3f) & 1) == 0)) {
    if (TVar9.kind != DefaultKeyword) {
      pMVar5 = parseSingleMember(this,ClockingItem);
      return pMVar5;
    }
    local_148 = ParserBase::consume(&this->super_ParserBase);
  }
  Token::Token(&local_158);
  Token::Token(&local_138);
  bVar1 = ParserBase::peek(&this->super_ParserBase,InOutKeyword);
  if (bVar1) {
    local_158 = ParserBase::consume(&this->super_ParserBase);
    if (local_148.info != (Info *)0x0) {
      SVar3 = Token::location(&local_158);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4d0005,SVar3);
    }
    outputSkew = (ClockingSkewSyntax *)0x0;
    inputSkew = (ClockingSkewSyntax *)0x0;
  }
  else {
    bVar1 = ParserBase::peek(&this->super_ParserBase,InputKeyword);
    if (bVar1) {
      local_158 = ParserBase::consume(&this->super_ParserBase);
      inputSkew = parseClockingSkew(this);
      if ((inputSkew == (ClockingSkewSyntax *)0x0) && (local_148.info != (Info *)0x0)) {
        SVar3 = Token::location(&local_158);
        sVar10 = Token::rawText(&local_158);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x230005,
                            (SourceLocation)((long)SVar3 + sVar10._M_len * 0x10000000));
        goto LAB_00349056;
      }
    }
    else {
LAB_00349056:
      inputSkew = (ClockingSkewSyntax *)0x0;
    }
    bVar1 = ParserBase::peek(&this->super_ParserBase,OutputKeyword);
    if (bVar1) {
      local_138 = ParserBase::consume(&this->super_ParserBase);
      outputSkew = parseClockingSkew(this);
      if ((outputSkew == (ClockingSkewSyntax *)0x0) && (local_148.info != (Info *)0x0)) {
        SVar3 = Token::location(&local_138);
        sVar10 = Token::rawText(&local_138);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x230005,
                            (SourceLocation)((long)SVar3 + sVar10._M_len * 0x10000000));
        goto LAB_003490c3;
      }
    }
    else {
LAB_003490c3:
      outputSkew = (ClockingSkewSyntax *)0x0;
    }
    if (((local_148.info != (Info *)0x0) && (local_158.info == (Info *)0x0)) &&
       (local_138.info == (Info *)0x0)) {
      SVar3 = Token::location(&local_148);
      sVar10 = Token::valueText(&local_148);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x230005,
                          (SourceLocation)((long)SVar3 + sVar10._M_len * 0x10000000));
    }
  }
  this_00 = &this->factory;
  direction = slang::syntax::SyntaxFactory::clockingDirection
                        (this_00,local_158,inputSkew,local_138,outputSkew);
  TVar9 = local_148;
  if (local_148.info != (Info *)0x0) {
    local_a8._8_8_ = (SyntaxNode *)0x0;
    local_a8._16_4_ = SyntaxList;
    local_90[0].super_ConstTokenOrSyntax.
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
    _M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
    local_90[0].super_ConstTokenOrSyntax.
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._M_u.
    _M_first._M_storage.info = (Info *)0x0;
    local_90[0].super_ConstTokenOrSyntax.
    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._16_8_ =
         0;
    local_a8._0_8_ = &PTR_getChild_00508348;
    local_e8 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pDVar4 = slang::syntax::SyntaxFactory::defaultSkewItem
                       (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_a8,TVar9
                        ,direction,local_e8);
    return &pDVar4->super_MemberSyntax;
  }
  Token::Token(&local_128);
  local_a8._0_8_ = local_90;
  local_a8._8_8_ = (SyntaxNode *)0x0;
  local_a8._16_8_ = 4;
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  local_d8 = TVar9;
  bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar9.kind);
  if (bVar1) {
    SVar3 = Token::location(&local_d8);
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x310005,SVar3);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(TVar9.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar9,Semicolon,&local_128,(DiagCode)0x310005);
      TVar9.info = extraout_RDX;
      TVar9.kind = (short)extraout_RAX;
      TVar9._2_1_ = (char)((ulong)extraout_RAX >> 0x10);
      TVar9.numFlags.raw = (char)((ulong)extraout_RAX >> 0x18);
      TVar9.rawLen = (int)((ulong)extraout_RAX >> 0x20);
      goto LAB_0034936b;
    }
    do {
      TVar9 = ParserBase::peek(&this->super_ParserBase);
      pAVar6 = parseAttributeSpec(this);
      local_118._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pAVar6;
      local_108 = CONCAT31(local_108._1_3_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                 (TokenOrSyntax *)&local_118._M_first);
      TVar11 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar11.kind);
      if ((bVar1) || (bVar1 = ParserBase::peek(&this->super_ParserBase,Comma), !bVar1)) break;
      local_118._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           ParserBase::expect(&this->super_ParserBase,Comma);
      local_108 = local_108 & 0xffffff00;
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                 (TokenOrSyntax *)&local_118._M_first);
      TVar11 = ParserBase::peek(&this->super_ParserBase);
      bVar1 = slang::syntax::SyntaxFacts::isSemicolon(TVar11.kind);
      if (bVar1) {
        ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
        break;
      }
      TVar11 = ParserBase::peek(&this->super_ParserBase);
    } while ((TVar9.info != TVar11.info || TVar9.kind != TVar11.kind) ||
            (bVar1 = ParserBase::
                     skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                               (&this->super_ParserBase,(DiagCode)0x310005,true), bVar1));
  }
  TVar9 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  local_128 = TVar9;
LAB_0034936b:
  local_108 = 1;
  local_100 = 0;
  uStack_f8 = 0;
  local_f0 = 0;
  local_118 = (_Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>)
              ZEXT816(0x508348);
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_a8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)TVar9.info);
  local_b8 = (pointer)CONCAT44(extraout_var,iVar2);
  local_c8 = SeparatedList;
  local_d8 = (Token)ZEXT816(0x50adf0);
  pCVar7 = slang::syntax::SyntaxFactory::clockingItem
                     (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                              &local_118._M_first,direction,
                      (SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)&local_d8,local_128
                     );
  if ((TokenOrSyntax *)local_a8._0_8_ != local_90) {
    free((void *)local_a8._0_8_);
  }
  return &pCVar7->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseClockingItem() {
    Token def;
    switch (peek().kind) {
        case TokenKind::DefaultKeyword:
            def = consume();
            break;
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
            break;
        default:
            return parseSingleMember(SyntaxKind::ClockingItem);
    }

    Token input, output;
    ClockingSkewSyntax* inputSkew = nullptr;
    ClockingSkewSyntax* outputSkew = nullptr;
    if (peek(TokenKind::InOutKeyword)) {
        input = consume();
        if (def)
            addDiag(diag::InOutDefaultSkew, input.location());
    }
    else {
        if (peek(TokenKind::InputKeyword)) {
            input = consume();
            inputSkew = parseClockingSkew();
            if (def && !inputSkew)
                addDiag(diag::ExpectedClockingSkew, input.location() + input.rawText().length());
        }

        if (peek(TokenKind::OutputKeyword)) {
            output = consume();
            outputSkew = parseClockingSkew();
            if (def && !outputSkew)
                addDiag(diag::ExpectedClockingSkew, output.location() + output.rawText().length());
        }

        if (def && !input && !output)
            addDiag(diag::ExpectedClockingSkew, def.location() + def.valueText().length());
    }

    auto& direction = factory.clockingDirection(input, inputSkew, output, outputSkew);
    if (def)
        return &factory.defaultSkewItem(nullptr, def, direction, expect(TokenKind::Semicolon));

    Token semi;
    SmallVector<TokenOrSyntax, 4> decls;
    parseList<isIdentifierOrComma, isSemicolon>(decls, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedIdentifier,
                                                [this] { return &parseAttributeSpec(); });

    return &factory.clockingItem(nullptr, direction, decls.copy(alloc), semi);
}